

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptSamplerDeclarationDX9(HlslGrammar *this,TType *param_1)

{
  bool bVar1;
  char *syntax;
  HlslToken local_30;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSampler);
  if (bVar1) {
    unimplemented(this,"Direct3D 9 sampler declaration");
    bVar1 = acceptIdentifier(this,&local_30);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar1) {
        return false;
      }
      syntax = "=";
    }
    else {
      syntax = "sampler name";
    }
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptSamplerDeclarationDX9(TType& /*type*/)
{
    if (! acceptTokenClass(EHTokSampler))
        return false;

    // TODO: remove this when DX9 style declarations are implemented.
    unimplemented("Direct3D 9 sampler declaration");

    // read sampler name
    HlslToken name;
    if (! acceptIdentifier(name)) {
        expected("sampler name");
        return false;
    }

    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    return false;
}